

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
serialize<boost::archive::text_iarchive>
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,text_iarchive *ar,
          uint version)

{
  undefined8 *puVar1;
  long lVar2;
  undefined1 *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  int c;
  int r;
  int local_38;
  int local_34;
  
  local_34 = (int)(this->m_storage).m_rows;
  local_38 = (int)(this->m_storage).m_cols;
  this_00 = &ar->field_0x28;
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            &local_34);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)this_00,
            &local_38);
  lVar4 = (long)local_34;
  lVar2 = (long)local_38;
  if ((lVar2 != 0 && lVar4 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar2),0) < lVar4)) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = operator_delete;
    __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize(&this->m_storage,lVar2 * lVar4,lVar4,lVar2);
  if (0 < local_38) {
    lVar4 = 0;
    lVar2 = 0;
    do {
      if (0 < local_34) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>
          ::load<double>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>
                          *)this_00,
                         (double *)
                         ((long)(this->m_storage).m_data + lVar5 + (this->m_storage).m_rows * lVar4)
                        );
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 8;
        } while (lVar3 < local_34);
      }
      lVar2 = lVar2 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar2 < local_38);
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}